

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::make_init_node_1
          (branch_and_bound_solver<baryonyx::itm::maximize_tag,_float> *this)

{
  pointer __args;
  pointer pnVar1;
  size_type i;
  value_type *pvVar2;
  size_t __len;
  ulong __n;
  uint local_c;
  
  __args = (this->items).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c = 0;
  std::
  vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::node>>
  ::emplace_back<float&,int&,unsigned_int>
            ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::node>>
              *)&this->nodes,&__args->r,&__args->factor,&local_c);
  i = shared_subvector::emplace(&this->subvector);
  pnVar1 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pnVar1[-1].variables = i;
  pnVar1[-1].z = ((this->items).
                  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item>_>
                  ._M_impl.super__Vector_impl_data._M_start)->sum_z;
  __n = (ulong)(this->subvector).m_element_size;
  if (__n != 0) {
    memset((this->subvector).m_container.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start + i,0,__n);
    i = (this->nodes).
        super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].variables;
  }
  pvVar2 = shared_subvector::operator[](&this->subvector,i);
  *pvVar2 = '\x01';
  return;
}

Assistant:

void make_init_node_1()
    {
        nodes.emplace_back(items[0].r, items[0].factor, 0u);
        nodes.back().variables = subvector.emplace();
        nodes.back().z = items[0].sum_z;

        subvector.fill(nodes.back().variables, 0);
        subvector[nodes.back().variables] = 1;
    }